

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator+=(String *this,uint c)

{
  String *pSVar1;
  String local_28;
  uint local_14;
  String *pSStack_10;
  uint c_local;
  String *this_local;
  
  local_14 = c;
  pSStack_10 = this;
  Print((char *)&local_28,"%u",(ulong)c);
  pSVar1 = operator+=(this,&local_28);
  ~String(&local_28);
  return pSVar1;
}

Assistant:

const String& String::operator +=(const unsigned int c)
    {
#ifndef HasFloatParsing
        char buffer[11] = { 0 };
        utoa((unsigned long)c, buffer, 10);
        return *this += buffer;
#else
        return *this += String::Print("%u", c);
#endif
    }